

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O0

void duckdb::WriteDataToPrimitiveSegment<bool>
               (ListSegmentFunctions *param_1,ArenaAllocator *param_2,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  bool bVar1;
  idx_t iVar2;
  bool *pbVar3;
  bool *pbVar4;
  data_ptr_t ptr;
  UnifiedVectorFormat *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  idx_t *in_R8;
  bool *input_data_ptr;
  bool *segment_data;
  bool valid;
  bool *null_mask;
  idx_t sel_entry_idx;
  idx_t in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  
  iVar2 = SelectionVector::get_index(in_RCX->sel,*in_R8);
  pbVar3 = GetNullMask((ListSegment *)0x3e8f71);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pbVar3[*(ushort *)CONCAT71(in_register_00000011,in_DL)] = (bool)((bVar1 ^ 0xffU) & 1);
  if (bVar1) {
    pbVar3 = GetPrimitiveData<bool>((ListSegment *)0x3e8fba);
    pbVar4 = UnifiedVectorFormat::GetData<bool>(in_RCX);
    ptr = data_ptr_cast<bool>(pbVar3 + (int)(uint)*(ushort *)CONCAT71(in_register_00000011,in_DL));
    Store<bool>(pbVar4 + iVar2,ptr);
  }
  return;
}

Assistant:

static void WriteDataToPrimitiveSegment(const ListSegmentFunctions &, ArenaAllocator &, ListSegment *segment,
                                        RecursiveUnifiedVectorFormat &input_data, idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// write value
	if (valid) {
		auto segment_data = GetPrimitiveData<T>(segment);
		auto input_data_ptr = UnifiedVectorFormat::GetData<T>(input_data.unified);
		Store<T>(input_data_ptr[sel_entry_idx], data_ptr_cast(segment_data + segment->count));
	}
}